

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O0

bool instIsCallOf(Instruction *I,string *name,LLVMPointerAnalysis *pta)

{
  bool bVar1;
  byte bVar2;
  BasicBlock *pBVar3;
  Function *pFVar4;
  long *in_RDX;
  Instruction *in_RSI;
  Instruction *in_RDI;
  undefined1 auVar5 [16];
  LLVMPointer *ptr;
  const_iterator __end1;
  const_iterator __begin1;
  LLVMPointsToSet *__range1;
  Module *M_1;
  LLVMPointsToSet pts;
  Module *M;
  Value *V;
  Function *fun;
  CallInst *C;
  LLVMPointsToSet *in_stack_fffffffffffffef8;
  Instruction *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  string *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  StringRef *in_stack_ffffffffffffff28;
  LLVMPointer local_b8;
  LLVMPointer *local_a8;
  LLVMPointsToSetImpl *local_a0;
  LLVMPointsToSetImpl *local_98;
  undefined1 *local_90;
  undefined4 local_84;
  Module *local_80;
  undefined1 local_78 [8];
  Module *local_70;
  Value *local_68;
  undefined1 local_60 [16];
  string local_50 [32];
  Function *local_30;
  ret_type local_28;
  long *local_20;
  Instruction *local_18;
  Instruction *local_10;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = llvm::dyn_cast<llvm::CallInst,llvm::Instruction_const>(in_stack_ffffffffffffff00);
  if (local_28 == (ret_type)0x0) {
    local_1 = false;
  }
  else {
    local_30 = llvm::CallBase::getCalledFunction
                         ((CallBase *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08))
    ;
    if (local_30 == (Function *)0x0) {
      llvm::CallBase::getCalledOperand((CallBase *)0x1e1025);
      local_68 = llvm::Value::stripPointerCasts((Value *)0x1e102d);
      if (local_20 == (long *)0x0) {
        pBVar3 = llvm::Instruction::getParent(local_10);
        pFVar4 = llvm::BasicBlock::getParent(pBVar3);
        local_70 = llvm::GlobalValue::getParent((GlobalValue *)pFVar4);
        local_1 = funHasAddrTaken((Module *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      }
      else {
        (**(code **)(*local_20 + 8))(local_78,local_20,local_68);
        bVar1 = dg::LLVMPointsToSet::empty((LLVMPointsToSet *)0x1e10b3);
        if (bVar1) {
          pBVar3 = llvm::Instruction::getParent(local_10);
          pFVar4 = llvm::BasicBlock::getParent(pBVar3);
          local_80 = llvm::GlobalValue::getParent((GlobalValue *)pFVar4);
          local_1 = funHasAddrTaken((Module *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        }
        else {
          local_90 = local_78;
          local_98 = (LLVMPointsToSetImpl *)dg::LLVMPointsToSet::begin(in_stack_fffffffffffffef8);
          local_a0 = (LLVMPointsToSetImpl *)dg::LLVMPointsToSet::end();
          while (bVar1 = dg::LLVMPointsToSet::const_iterator::operator!=
                                   ((const_iterator *)in_stack_ffffffffffffff00,
                                    (const_iterator *)in_stack_fffffffffffffef8), bVar1) {
            local_b8 = dg::LLVMPointsToSet::const_iterator::operator*((const_iterator *)0x1e1154);
            local_a8 = &local_b8;
            local_30 = llvm::dyn_cast<llvm::Function,llvm::Value>
                                 ((Value *)in_stack_ffffffffffffff00);
            if (local_30 != (ret_type)0x0) {
              in_stack_ffffffffffffff00 = local_18;
              auVar5 = llvm::Value::getName();
              llvm::StringRef::str_abi_cxx11_(in_stack_ffffffffffffff28);
              bVar2 = std::operator==(auVar5._8_8_,auVar5._0_8_);
              std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
              if ((bVar2 & 1) != 0) {
                local_1 = true;
                goto LAB_001e121d;
              }
            }
            dg::LLVMPointsToSet::const_iterator::operator++
                      ((const_iterator *)in_stack_ffffffffffffff00);
          }
          local_1 = false;
        }
LAB_001e121d:
        local_84 = 1;
        dg::LLVMPointsToSet::~LLVMPointsToSet((LLVMPointsToSet *)0x1e122a);
      }
    }
    else {
      local_60 = llvm::Value::getName();
      llvm::StringRef::str_abi_cxx11_(in_stack_ffffffffffffff28);
      local_1 = std::operator==(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      std::__cxx11::string::~string(local_50);
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

static bool instIsCallOf(const llvm::Instruction &I, const std::string &name,
                         LLVMPointerAnalysis *pta = nullptr) {
    const auto *C = llvm::dyn_cast<llvm::CallInst>(&I);
    if (!C)
        return false;

    auto *fun = C->getCalledFunction();
    if (fun) {
        return name == fun->getName().str();
    }

#if LLVM_VERSION_MAJOR >= 8
    auto *V = C->getCalledOperand()->stripPointerCasts();
#else
    auto *V = C->getCalledValue()->stripPointerCasts();
#endif

    if (!pta) {
        auto *M = I.getParent()->getParent()->getParent();
        return funHasAddrTaken(M, name);
    }

    auto pts = pta->getLLVMPointsTo(V);
    if (pts.empty()) {
        auto *M = I.getParent()->getParent()->getParent();
        return funHasAddrTaken(M, name);
    }

    for (const auto &ptr : pts) {
        fun = llvm::dyn_cast<llvm::Function>(ptr.value);
        if (!fun)
            continue;
        if (name == fun->getName().str())
            return true;
    }

    return false;
}